

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
* __thiscall
cppcms::json::variant::
get<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
          (variant *this)

{
  undefined8 uVar1;
  map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *pmVar2;
  variant *in_RDI;
  json_type expected;
  json_type in_stack_00000124;
  string *in_stack_00000128;
  json_type in_stack_00000130;
  json_type in_stack_00000134;
  string *in_stack_00000138;
  bad_value_cast *in_stack_00000140;
  allocator local_69;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [36];
  undefined4 local_c;
  
  local_c = 5;
  if (in_RDI->type != is_object) {
    local_45 = 1;
    uVar1 = __cxa_allocate_exception(0x48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"invalid type",&local_31);
    bad_value_cast::bad_value_cast
              (in_stack_00000140,in_stack_00000138,in_stack_00000134,in_stack_00000130);
    local_45 = 0;
    __cxa_throw(uVar1,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
  }
  if (in_RDI->type < is_boolean) {
    uVar1 = __cxa_allocate_exception(0x48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"non-fetchable type",&local_69);
    bad_value_cast::bad_value_cast
              ((bad_value_cast *)CONCAT44(in_stack_00000134,in_stack_00000130),in_stack_00000128,
               in_stack_00000124);
    __cxa_throw(uVar1,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
  }
  pmVar2 = (map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            *)ptr(in_RDI);
  return pmVar2;
}

Assistant:

T &get()
		{
			json_type expected = json_type_traits<T>::type;
			if(expected != type) 
				throw bad_value_cast("invalid type",expected,type);
			switch(type) {
			case is_undefined:
			case is_null:
				throw bad_value_cast("non-fetchable type",type);
			default:
				return *static_cast<T *>(ptr());
			}
		}